

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void vdbeMemClear(Mem *p)

{
  void *in_RDI;
  
  if ((*(ushort *)((long)in_RDI + 8) & 0x2460) != 0) {
    vdbeMemClearExternAndSetNull(p);
  }
  if (*(int *)((long)in_RDI + 0x20) != 0) {
    sqlite3DbFree((sqlite3 *)p,in_RDI);
    *(undefined4 *)((long)in_RDI + 0x20) = 0;
  }
  *(undefined8 *)((long)in_RDI + 0x10) = 0;
  return;
}

Assistant:

static SQLITE_NOINLINE void vdbeMemClear(Mem *p){
  if( VdbeMemDynamic(p) ){
    vdbeMemClearExternAndSetNull(p);
  }
  if( p->szMalloc ){
    sqlite3DbFree(p->db, p->zMalloc);
    p->szMalloc = 0;
  }
  p->z = 0;
}